

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionPropertyRequiredWorkgroupSize
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  uint uVar3;
  char *pcVar4;
  DiagnosticStream DStack_1f8;
  
  sVar2 = ValidateKernelDecl(_,inst);
  if (sVar2 == SPV_SUCCESS) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar1 = IsUint32Constant(_,uVar3);
    if (bVar1) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      bVar1 = IsUint32Constant(_,uVar3);
      if (bVar1) {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,7);
        bVar1 = IsUint32Constant(_,uVar3);
        if (bVar1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar4 = "Z must be a 32-bit unsigned integer OpConstant";
      }
      else {
        ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
        pcVar4 = "Y must be a 32-bit unsigned integer OpConstant";
      }
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar4 = "X must be a 32-bit unsigned integer OpConstant";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar4,0x2e);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
    sVar2 = DStack_1f8.error_;
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateClspvReflectionPropertyRequiredWorkgroupSize(
    ValidationState_t& _, const Instruction* inst) {
  if (auto error = ValidateKernelDecl(_, inst)) {
    return error;
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "X must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Y must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Z must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}